

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nrand.cc
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  NormalDistributedRandomValueGeneration *this;
  allocator local_221;
  int output_length;
  int seed;
  NormalDistributedRandomValueGeneration generator;
  double standard_deviation;
  double variance;
  double random;
  double mean;
  ostringstream error_message;
  
  output_length = -1;
  mean = 0.0;
  seed = 1;
  standard_deviation = 1.0;
LAB_001025af:
  do {
    iVar4 = ya_getopt_long(argc,argv,"l:m:s:u:v:d:h",(option *)0x0,(int *)0x0);
    switch(iVar4) {
    case 0x68:
      anon_unknown.dwarf_20fc::PrintUsage((ostream *)&std::cout);
      return 0;
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x74:
switchD_001025d4_caseD_69:
      anon_unknown.dwarf_20fc::PrintUsage((ostream *)&std::cerr);
      return 1;
    case 0x6c:
      std::__cxx11::string::string((string *)&error_message,ya_optarg,(allocator *)&generator);
      bVar2 = sptk::ConvertStringToInteger((string *)&error_message,&output_length);
      bVar3 = output_length < 1;
      std::__cxx11::string::~string((string *)&error_message);
      if (!bVar2 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        std::operator<<((ostream *)&error_message,
                        "The argument for the -l option must be a positive integer");
        std::__cxx11::string::string((string *)&generator,"nrand",(allocator *)&variance);
        sptk::PrintErrorMessage((string *)&generator,&error_message);
        goto LAB_00102ab5;
      }
      goto LAB_001025af;
    case 0x6d:
      std::__cxx11::string::string((string *)&error_message,ya_optarg,(allocator *)&generator);
      bVar3 = sptk::ConvertStringToInteger((string *)&error_message,&output_length);
      bVar2 = output_length < 0;
      std::__cxx11::string::~string((string *)&error_message);
      if (!bVar3 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        std::operator<<((ostream *)&error_message,
                        "The argument for the -m option must be a non-negative integer");
        std::__cxx11::string::string((string *)&generator,"nrand",(allocator *)&variance);
        sptk::PrintErrorMessage((string *)&generator,&error_message);
        goto LAB_00102ab5;
      }
      output_length = output_length + 1;
      goto LAB_001025af;
    case 0x73:
      std::__cxx11::string::string((string *)&error_message,ya_optarg,(allocator *)&generator);
      bVar3 = sptk::ConvertStringToInteger((string *)&error_message,&seed);
      std::__cxx11::string::~string((string *)&error_message);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        std::operator<<((ostream *)&error_message,
                        "The argument for the -s option must be an integer");
        std::__cxx11::string::string((string *)&generator,"nrand",(allocator *)&variance);
        sptk::PrintErrorMessage((string *)&generator,&error_message);
        goto LAB_00102ab5;
      }
      goto LAB_001025af;
    case 0x75:
      std::__cxx11::string::string((string *)&error_message,ya_optarg,(allocator *)&generator);
      bVar3 = sptk::ConvertStringToDouble((string *)&error_message,&mean);
      std::__cxx11::string::~string((string *)&error_message);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        std::operator<<((ostream *)&error_message,"The argument for the -u option must be numeric");
        std::__cxx11::string::string((string *)&generator,"nrand",(allocator *)&variance);
        sptk::PrintErrorMessage((string *)&generator,&error_message);
        goto LAB_00102ab5;
      }
      goto LAB_001025af;
    case 0x76:
      std::__cxx11::string::string((string *)&error_message,ya_optarg,(allocator *)&generator);
      bVar3 = sptk::ConvertStringToDouble((string *)&error_message,&variance);
      dVar1 = variance;
      std::__cxx11::string::~string((string *)&error_message);
      if (!bVar3 || dVar1 < 0.0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        std::operator<<((ostream *)&error_message,
                        "The argument for the -v option must be a non-negative number");
        std::__cxx11::string::string((string *)&generator,"nrand",(allocator *)&random);
        sptk::PrintErrorMessage((string *)&generator,&error_message);
        goto LAB_00102ab5;
      }
      if (variance < 0.0) {
        standard_deviation = sqrt(variance);
      }
      else {
        standard_deviation = SQRT(variance);
      }
      goto LAB_001025af;
    }
    if (iVar4 != 100) {
      if (iVar4 != -1) goto switchD_001025d4_caseD_69;
      if (ya_optind != argc) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        std::operator<<((ostream *)&error_message,"Input file is not required");
        std::__cxx11::string::string((string *)&generator,"nrand",(allocator *)&variance);
        sptk::PrintErrorMessage((string *)&generator,&error_message);
        goto LAB_00102ab5;
      }
      bVar3 = sptk::SetBinaryMode();
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        std::operator<<((ostream *)&error_message,"Cannot set translation mode");
        std::__cxx11::string::string((string *)&generator,"nrand",(allocator *)&variance);
        sptk::PrintErrorMessage((string *)&generator,&error_message);
        goto LAB_00102ab5;
      }
      sptk::NormalDistributedRandomValueGeneration::NormalDistributedRandomValueGeneration
                (&generator,seed);
      iVar4 = 0;
      goto LAB_001027e9;
    }
    std::__cxx11::string::string((string *)&error_message,ya_optarg,(allocator *)&generator);
    bVar2 = sptk::ConvertStringToDouble((string *)&error_message,&standard_deviation);
    bVar3 = 0.0 <= standard_deviation;
    std::__cxx11::string::~string((string *)&error_message);
  } while (bVar2 && bVar3);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
  std::operator<<((ostream *)&error_message,
                  "The argument for the -d option must be a non-negative number");
  std::__cxx11::string::string((string *)&generator,"nrand",(allocator *)&variance);
  sptk::PrintErrorMessage((string *)&generator,&error_message);
LAB_00102ab5:
  this = &generator;
LAB_00102aba:
  std::__cxx11::string::~string((string *)this);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
  return 1;
LAB_001027e9:
  if (output_length != -1 && output_length <= iVar4) {
    return 0;
  }
  bVar3 = sptk::NormalDistributedRandomValueGeneration::Get(&generator,&random);
  if (!bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    std::operator<<((ostream *)&error_message,"Failed to generate random values");
    std::__cxx11::string::string((string *)&variance,"nrand",&local_221);
    sptk::PrintErrorMessage((string *)&variance,&error_message);
LAB_00102b77:
    this = (NormalDistributedRandomValueGeneration *)&variance;
    goto LAB_00102aba;
  }
  bVar3 = sptk::WriteStream<double>(random * standard_deviation + mean,(ostream *)&std::cout);
  if (!bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
    std::operator<<((ostream *)&error_message,"Failed to write random values");
    std::__cxx11::string::string((string *)&variance,"nrand",&local_221);
    sptk::PrintErrorMessage((string *)&variance,&error_message);
    goto LAB_00102b77;
  }
  iVar4 = iVar4 + 1;
  goto LAB_001027e9;
}

Assistant:

int main(int argc, char* argv[]) {
  int output_length(kMagicNumberForInfinity);
  int seed(kDefaultSeed);
  double mean(kDefaultMean);
  double standard_deviation(kDefaultStandardDeviation);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:s:u:v:d:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &output_length) ||
            output_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("nrand", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &output_length) ||
            output_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                           "non-negative integer";
          sptk::PrintErrorMessage("nrand", error_message);
          return 1;
        }
        ++output_length;
        break;
      }
      case 's': {
        if (!sptk::ConvertStringToInteger(optarg, &seed)) {
          std::ostringstream error_message;
          error_message << "The argument for the -s option must be an integer";
          sptk::PrintErrorMessage("nrand", error_message);
          return 1;
        }
        break;
      }
      case 'u': {
        if (!sptk::ConvertStringToDouble(optarg, &mean)) {
          std::ostringstream error_message;
          error_message << "The argument for the -u option must be numeric";
          sptk::PrintErrorMessage("nrand", error_message);
          return 1;
        }
        break;
      }
      case 'v': {
        double variance;
        if (!sptk::ConvertStringToDouble(optarg, &variance) || variance < 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -v option must be a non-negative number";
          sptk::PrintErrorMessage("nrand", error_message);
          return 1;
        }
        standard_deviation = std::sqrt(variance);
        break;
      }
      case 'd': {
        if (!sptk::ConvertStringToDouble(optarg, &standard_deviation) ||
            standard_deviation < 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -d option must be a non-negative number";
          sptk::PrintErrorMessage("nrand", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (0 != argc - optind) {
    std::ostringstream error_message;
    error_message << "Input file is not required";
    sptk::PrintErrorMessage("nrand", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("nrand", error_message);
    return 1;
  }

  sptk::NormalDistributedRandomValueGeneration generator(seed);

  for (int i(0); kMagicNumberForInfinity == output_length || i < output_length;
       ++i) {
    double random;
    if (!generator.Get(&random)) {
      std::ostringstream error_message;
      error_message << "Failed to generate random values";
      sptk::PrintErrorMessage("nrand", error_message);
      return 1;
    }
    const double output(mean + random * standard_deviation);
    if (!sptk::WriteStream(output, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write random values";
      sptk::PrintErrorMessage("nrand", error_message);
      return 1;
    }
  }

  return 0;
}